

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitter::~QSplitter(QSplitter *this)

{
  long lVar1;
  value_type pQVar2;
  
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007d4f08;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QSplitter_007d50c8;
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 0x278) != 0) && (*(int *)(*(long *)(lVar1 + 0x278) + 4) != 0)) &&
     (*(long **)(lVar1 + 0x280) != (long *)0x0)) {
    (**(code **)(**(long **)(lVar1 + 0x280) + 0x20))();
  }
  while (*(long *)(lVar1 + 0x298) != 0) {
    pQVar2 = QList<QSplitterLayoutStruct_*>::takeFirst
                       ((QList<QSplitterLayoutStruct_*> *)(lVar1 + 0x288));
    if ((pQVar2 != (value_type)0x0) && (pQVar2->handle != (QSplitterHandle *)0x0)) {
      (**(code **)(*(long *)&pQVar2->handle->super_QWidget + 0x20))();
    }
    operator_delete(pQVar2,0x28);
  }
  QFrame::~QFrame(&this->super_QFrame);
  return;
}

Assistant:

QSplitter::~QSplitter()
{
    Q_D(QSplitter);
#if QT_CONFIG(rubberband)
    delete d->rubberBand;
#endif
    while (!d->list.isEmpty())
        delete d->list.takeFirst();
}